

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

bool __thiscall mjs::object::can_put(object *this,wstring_view *name)

{
  bool bVar1;
  property_attribute attributes;
  
  while( true ) {
    attributes = (*this->_vptr_object[6])(this,name);
    if (invalid < attributes) {
      __assert_fail("static_cast<unsigned>(a) <= static_cast<unsigned>(property_attribute::invalid)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/property_attribute.h"
                    ,0x24,"bool mjs::is_valid(property_attribute)");
    }
    if (attributes != invalid) break;
    if ((this->prototype_).pos_ == 0) {
      return this->extensible_;
    }
    this = gc_heap_ptr_untracked<mjs::object,_true>::dereference(&this->prototype_,this->heap_);
  }
  bVar1 = has_attributes(attributes,read_only);
  return !bVar1;
}

Assistant:

bool object::can_put(const std::wstring_view& name) const {
    auto a = own_property_attributes(name);
    if (is_valid(a)) {
        return !has_attributes(a, property_attribute::read_only);
    }
    if (!prototype_) {
        return extensible_;
    }
    return prototype_.dereference(heap()).can_put(name);
}